

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscSystemFuncs.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::SequenceMethodExprVisitor::
visit<slang::ast::SimpleAssignmentPatternExpression>
          (SequenceMethodExprVisitor *this,SimpleAssignmentPatternExpression *expr)

{
  size_type sVar1;
  pointer ppEVar2;
  Expression *this_00;
  Symbol *pSVar3;
  Diagnostic *this_01;
  long lVar4;
  
  if ((expr->super_AssignmentPatternExpressionBase).super_Expression.kind == NamedValue) {
    pSVar3 = Expression::getSymbolReference((Expression *)expr,true);
    if ((pSVar3 != (Symbol *)0x0) &&
       ((pSVar3->kind == LocalAssertionVar ||
        ((pSVar3->kind == AssertionPort && (*(char *)((long)&pSVar3[2].name._M_len + 4) == '\x01')))
        ))) {
      this_01 = ASTContext::addDiag(this->context,(DiagCode)0x23000b,
                                    (expr->super_AssignmentPatternExpressionBase).super_Expression.
                                    sourceRange);
      Diagnostic::operator<<(this_01,&this->name);
    }
  }
  sVar1 = (expr->super_AssignmentPatternExpressionBase).elements_.size_;
  if (sVar1 != 0) {
    ppEVar2 = (expr->super_AssignmentPatternExpressionBase).elements_.data_;
    lVar4 = 0;
    do {
      this_00 = *(Expression **)((long)ppEVar2 + lVar4);
      Expression::
      visitExpression<slang::ast::Expression_const,slang::ast::builtins::SequenceMethodExprVisitor&>
                (this_00,this_00,this);
      lVar4 = lVar4 + 8;
    } while (sVar1 << 3 != lVar4);
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (expr.kind == ExpressionKind::NamedValue) {
                if (auto sym = expr.getSymbolReference()) {
                    if (sym->kind == SymbolKind::LocalAssertionVar ||
                        (sym->kind == SymbolKind::AssertionPort &&
                         sym->template as<AssertionPortSymbol>().isLocalVar())) {
                        context.addDiag(diag::SequenceMethodLocalVar, expr.sourceRange) << name;
                    }
                }
            }
        }

        if constexpr (is_detected_v<ASTDetectors::visitExprs_t, T, SequenceMethodExprVisitor>)
            expr.visitExprs(*this);
    }